

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

string * __thiscall booster::locale::calendar::get_time_zone_abi_cxx11_(calendar *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

std::string calendar::get_time_zone() const
{
    return tz_;
}